

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O1

bool __thiscall
llvm::yaml::Scanner::findBlockScalarIndent
          (Scanner *this,uint *BlockIndent,uint BlockExitIndent,uint *LineBreaks,bool *IsDone)

{
  char *pcVar1;
  iterator pcVar2;
  char *pcVar3;
  iterator unaff_RBX;
  uint MaxAllSpaceLineCharacters;
  uint uVar4;
  char *Position;
  uint uVar5;
  bool bVar6;
  Twine local_48;
  
  uVar4 = 0;
  while( true ) {
    pcVar1 = this->End;
    pcVar3 = this->Current;
    do {
      Position = pcVar3;
      if (pcVar1 != pcVar3) {
        Position = pcVar3 + (*pcVar3 == ' ');
      }
      bVar6 = Position != pcVar3;
      pcVar3 = Position;
    } while (bVar6);
    uVar5 = ((int)Position - (int)this->Current) + this->Column;
    this->Column = uVar5;
    this->Current = Position;
    pcVar2 = skip_nb_char(this,Position);
    if (pcVar2 != Position) break;
    if (pcVar1 != Position) {
      if (*Position == '\n') {
        pcVar3 = Position + 1;
      }
      else if (((*Position == '\r') && (pcVar3 = Position + 1, pcVar3 != pcVar1)) &&
              (Position[1] == '\n')) {
        pcVar3 = Position + 2;
      }
    }
    pcVar2 = Position;
    if (uVar5 <= uVar4) {
      uVar5 = uVar4;
      pcVar2 = unaff_RBX;
    }
    if (pcVar3 != Position) {
      uVar4 = uVar5;
      unaff_RBX = pcVar2;
    }
    if ((pcVar1 == Position) || (bVar6 = consumeLineBreakIfPresent(this), !bVar6))
    goto LAB_0018bd77;
    *LineBreaks = *LineBreaks + 1;
  }
  if (BlockExitIndent < uVar5) {
    *BlockIndent = uVar5;
    if (uVar4 <= uVar5) {
      return true;
    }
    Twine::Twine(&local_48,"Leading all-spaces line must be smaller than the block indent");
    setError(this,&local_48,unaff_RBX);
    return false;
  }
LAB_0018bd77:
  *IsDone = true;
  return true;
}

Assistant:

bool Scanner::findBlockScalarIndent(unsigned &BlockIndent,
                                    unsigned BlockExitIndent,
                                    unsigned &LineBreaks, bool &IsDone) {
  unsigned MaxAllSpaceLineCharacters = 0;
  StringRef::iterator LongestAllSpaceLine;

  while (true) {
    advanceWhile(&Scanner::skip_s_space);
    if (skip_nb_char(Current) != Current) {
      // This line isn't empty, so try and find the indentation.
      if (Column <= BlockExitIndent) { // End of the block literal.
        IsDone = true;
        return true;
      }
      // We found the block's indentation.
      BlockIndent = Column;
      if (MaxAllSpaceLineCharacters > BlockIndent) {
        setError(
            "Leading all-spaces line must be smaller than the block indent",
            LongestAllSpaceLine);
        return false;
      }
      return true;
    }
    if (skip_b_break(Current) != Current &&
        Column > MaxAllSpaceLineCharacters) {
      // Record the longest all-space line in case it's longer than the
      // discovered block indent.
      MaxAllSpaceLineCharacters = Column;
      LongestAllSpaceLine = Current;
    }

    // Check for EOF.
    if (Current == End) {
      IsDone = true;
      return true;
    }

    if (!consumeLineBreakIfPresent()) {
      IsDone = true;
      return true;
    }
    ++LineBreaks;
  }
  return true;
}